

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O0

void __thiscall
Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::ClearRenderTarget
          (DeviceContextBase<Diligent::EngineVkImplTraits> *this,ITextureView *pView)

{
  bool bVar1;
  undefined *puVar2;
  bool bVar3;
  COMMAND_QUEUE_TYPE CVar4;
  Char *pCVar5;
  TextureViewVkImpl *pTVar6;
  RenderPassVkImpl *pRVar7;
  RenderDeviceVkImpl *this_00;
  RenderDeviceInfo *this_01;
  undefined8 uVar8;
  COMMAND_QUEUE_TYPE Type;
  char *in_R8;
  char (*in_R9) [8];
  char (*in_stack_fffffffffffffe48) [97];
  undefined1 local_160 [8];
  string _msg_1;
  string _msg;
  string msg_5;
  Uint32 i;
  bool RTFound;
  undefined1 local_f0 [8];
  string msg_4;
  TextureViewDesc *ViewDesc;
  undefined1 local_a8 [8];
  string msg_3;
  string msg_2;
  string msg_1;
  undefined1 local_38 [8];
  string msg;
  ITextureView *pView_local;
  DeviceContextBase<Diligent::EngineVkImplTraits> *this_local;
  
  msg.field_2._8_8_ = pView;
  if (pView == (ITextureView *)0x0) {
    FormatString<char[45]>
              ((string *)local_38,(char (*) [45])"Render target view to clear must not be null");
    pCVar5 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar5,"ClearRenderTarget",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x65a);
    std::__cxx11::string::~string((string *)local_38);
  }
  if ((this->m_Desc).QueueType == COMMAND_QUEUE_TYPE_UNKNOWN) {
    bVar3 = IsDeferred(this);
    if (!bVar3) {
      FormatString<char[79]>
                ((string *)((long)&msg_2.field_2 + 8),
                 (char (*) [79])
                 "Queue type may never be unknown for immediate contexts. This looks like a bug.");
      pCVar5 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar5,"ClearRenderTarget",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x65b);
      std::__cxx11::string::~string((string *)(msg_2.field_2._M_local_buf + 8));
    }
    FormatString<char[97]>
              ((string *)((long)&msg_3.field_2 + 8),
               (char (*) [97])
               "Queue type is UNKNOWN. This indicates that Begin() has never been called for a deferred context."
              );
    pCVar5 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar5,"ClearRenderTarget",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x65b);
    std::__cxx11::string::~string((string *)(msg_3.field_2._M_local_buf + 8));
  }
  CVar4 = Diligent::operator&((this->m_Desc).QueueType,COMMAND_QUEUE_TYPE_GRAPHICS);
  if (CVar4 != COMMAND_QUEUE_TYPE_GRAPHICS) {
    GetCommandQueueTypeString_abi_cxx11_
              ((String *)&ViewDesc,(Diligent *)(ulong)(this->m_Desc).QueueType,Type);
    in_R8 = " queue.";
    FormatString<char[18],char[22],std::__cxx11::string,char[8]>
              ((string *)local_a8,(Diligent *)"ClearRenderTarget",(char (*) [18])0xf4cb59,
               (char (*) [22])&ViewDesc,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)" queue.",in_R9)
    ;
    std::__cxx11::string::~string((string *)&ViewDesc);
    pCVar5 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar5,"ClearRenderTarget",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x65b);
    std::__cxx11::string::~string((string *)local_a8);
  }
  msg_4.field_2._8_8_ = (**(code **)(*(long *)msg.field_2._8_8_ + 0x20))();
  if (*(char *)(msg_4.field_2._8_8_ + 8) != '\x02') {
    _i = GetTexViewTypeLiteralName(*(TEXTURE_VIEW_TYPE *)(msg_4.field_2._8_8_ + 8));
    in_R8 = (char *)(**(code **)(*(long *)msg.field_2._8_8_ + 0x20))();
    FormatString<char[11],char_const*,char[20],char_const*,char[97]>
              ((string *)local_f0,(Diligent *)"The type (",(char (*) [11])&i,
               (char **)") of texture view \'",(char (*) [20])in_R8,
               (char **)
               "\' is invalid: ClearRenderTarget command expects render target view (TEXTURE_VIEW_RENDER_TARGET)."
               ,in_stack_fffffffffffffe48);
    pCVar5 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar5,"ClearRenderTarget",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x662);
    std::__cxx11::string::~string((string *)local_f0);
  }
  bVar3 = false;
  msg_5.field_2._8_4_ = 0;
  while( true ) {
    bVar1 = false;
    if ((uint)msg_5.field_2._8_4_ < this->m_NumBoundRenderTargets) {
      bVar1 = (bool)(bVar3 ^ 1);
    }
    if (!bVar1) break;
    pTVar6 = Diligent::RefCntAutoPtr::operator_cast_to_TextureViewVkImpl_
                       ((RefCntAutoPtr *)(this->m_pBoundRenderTargets + (uint)msg_5.field_2._8_4_));
    bVar3 = pTVar6 == (TextureViewVkImpl *)msg.field_2._8_8_;
    msg_5.field_2._8_4_ = msg_5.field_2._8_4_ + 1;
  }
  if (!bVar3) {
    pRVar7 = Diligent::RefCntAutoPtr::operator_cast_to_RenderPassVkImpl_
                       ((RefCntAutoPtr *)&this->m_pActiveRenderPass);
    if (pRVar7 != (RenderPassVkImpl *)0x0) {
      FormatString<char[21],char_const*,char[158]>
                ((string *)((long)&_msg.field_2 + 8),(Diligent *)"Render target view \'",
                 (char (*) [21])msg_4.field_2._8_8_,
                 (char **)
                 "\' is not bound as framebuffer attachment. ClearRenderTarget command inside a render pass requires render target view to be bound as a framebuffer attachment."
                 ,(char (*) [158])in_R8);
      pCVar5 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar5,"ClearRenderTarget",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x66f);
      std::__cxx11::string::~string((string *)(_msg.field_2._M_local_buf + 8));
    }
    this_00 = RefCntAutoPtr<Diligent::RenderDeviceVkImpl>::operator->(&this->m_pDevice);
    this_01 = RenderDeviceBase<Diligent::EngineVkImplTraits>::GetDeviceInfo
                        ((RenderDeviceBase<Diligent::EngineVkImplTraits> *)this_00);
    bVar3 = RenderDeviceInfo::IsGLDevice(this_01);
    if (bVar3) {
      FormatString<char[21],char_const*,char[144]>
                ((string *)((long)&_msg_1.field_2 + 8),(Diligent *)"Render target view \'",
                 (char (*) [21])msg_4.field_2._8_8_,
                 (char **)
                 "\' is not bound to the device context. ClearRenderTarget command requires render target view to be bound to the device context in OpenGL backend"
                 ,(char (*) [144])in_R8);
      puVar2 = DebugMessageCallback;
      if (DebugMessageCallback != (undefined *)0x0) {
        uVar8 = std::__cxx11::string::c_str();
        (*(code *)puVar2)(2,uVar8,0);
      }
      std::__cxx11::string::~string((string *)(_msg_1.field_2._M_local_buf + 8));
    }
    else {
      FormatString<char[21],char_const*,char[191]>
                ((string *)local_160,(Diligent *)"Render target view \'",
                 (char (*) [21])msg_4.field_2._8_8_,
                 (char **)
                 "\' is not bound to the device context. ClearRenderTarget command is more efficient if render target view is bound to the device context. In OpenGL, Metal and WebGPU backends this is required."
                 ,(char (*) [191])in_R8);
      puVar2 = DebugMessageCallback;
      if (DebugMessageCallback != (undefined *)0x0) {
        uVar8 = std::__cxx11::string::c_str();
        (*(code *)puVar2)(1,uVar8,0);
      }
      std::__cxx11::string::~string((string *)local_160);
    }
  }
  (this->m_Stats).CommandCounters.ClearRenderTarget =
       (this->m_Stats).CommandCounters.ClearRenderTarget + 1;
  return;
}

Assistant:

inline void DeviceContextBase<ImplementationTraits>::ClearRenderTarget(ITextureView* pView)
{
    DEV_CHECK_ERR(pView != nullptr, "Render target view to clear must not be null");
    DVP_CHECK_QUEUE_TYPE_COMPATIBILITY(COMMAND_QUEUE_TYPE_GRAPHICS, "ClearRenderTarget");

#ifdef DILIGENT_DEVELOPMENT
    {
        const TextureViewDesc& ViewDesc = pView->GetDesc();
        DEV_CHECK_ERR(ViewDesc.ViewType == TEXTURE_VIEW_RENDER_TARGET,
                      "The type (", GetTexViewTypeLiteralName(ViewDesc.ViewType), ") of texture view '", pView->GetDesc().Name,
                      "' is invalid: ClearRenderTarget command expects render target view (TEXTURE_VIEW_RENDER_TARGET).");

        bool RTFound = false;
        for (Uint32 i = 0; i < m_NumBoundRenderTargets && !RTFound; ++i)
        {
            RTFound = m_pBoundRenderTargets[i] == pView;
        }

        if (!RTFound)
        {
            DEV_CHECK_ERR(m_pActiveRenderPass == nullptr,
                          "Render target view '", ViewDesc.Name,
                          "' is not bound as framebuffer attachment. ClearRenderTarget command inside a render pass "
                          "requires render target view to be bound as a framebuffer attachment.");

            if (m_pDevice->GetDeviceInfo().IsGLDevice())
            {
                LOG_ERROR_MESSAGE("Render target view '", ViewDesc.Name,
                                  "' is not bound to the device context. ClearRenderTarget command "
                                  "requires render target view to be bound to the device context in OpenGL backend");
            }
            else
            {
                LOG_DVP_WARNING_MESSAGE("Render target view '", ViewDesc.Name,
                                        "' is not bound to the device context. ClearRenderTarget command is more efficient "
                                        "if render target view is bound to the device context. In OpenGL, Metal and WebGPU backends this is required.");
            }
        }
    }
#endif

    ++m_Stats.CommandCounters.ClearRenderTarget;
}